

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O3

void mpz_xor(__mpz_struct *r,__mpz_struct *u,__mpz_struct *v)

{
  mp_limb_t *pmVar1;
  mp_limb_t *pmVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  mp_ptr pmVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar11;
  ulong uVar12;
  mp_limb_t mVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  __mpz_struct *p_Var17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar10;
  
  uVar9 = u->_mp_size;
  uVar22 = -uVar9;
  if (0 < (int)uVar9) {
    uVar22 = uVar9;
  }
  uVar9 = v->_mp_size;
  uVar4 = -uVar9;
  if (0 < (int)uVar9) {
    uVar4 = uVar9;
  }
  uVar8 = (ulong)uVar4;
  uVar16 = (ulong)uVar22;
  p_Var17 = v;
  if (uVar22 < uVar4) {
    uVar16 = uVar8;
    uVar8 = (ulong)uVar22;
    p_Var17 = u;
    u = v;
  }
  if (uVar8 == 0) {
    mpz_set(r,u);
    return;
  }
  uVar9 = (uint)u->_mp_size >> 0x1f;
  uVar10 = (ulong)uVar9;
  uVar22 = (uint)p_Var17->_mp_size >> 0x1f;
  uVar19 = (ulong)((uint)(p_Var17->_mp_size ^ u->_mp_size) >> 0x1f);
  if ((long)r->_mp_alloc < (long)(uVar16 + uVar19)) {
    pmVar6 = mpz_realloc(r,uVar16 + uVar19);
  }
  else {
    pmVar6 = r->_mp_d;
  }
  uVar7 = -uVar10;
  uVar14 = -uVar19;
  pmVar1 = u->_mp_d;
  pmVar2 = p_Var17->_mp_d;
  uVar15 = 0;
  uVar11 = (ulong)uVar22;
  do {
    uVar18 = uVar11;
    uVar11 = pmVar1[uVar15] ^ uVar7;
    uVar12 = uVar11 + uVar10;
    uVar10 = (ulong)CARRY8(uVar11,uVar10);
    uVar20 = pmVar2[uVar15] ^ -(ulong)uVar22;
    uVar21 = uVar20 + uVar18;
    uVar11 = uVar12 ^ uVar14 ^ uVar21;
    mVar13 = uVar11 + uVar19;
    uVar19 = (ulong)CARRY8(uVar11,uVar19);
    pmVar6[uVar15] = mVar13;
    uVar15 = uVar15 + 1;
    uVar11 = (ulong)CARRY8(uVar20,uVar18);
  } while (uVar8 != uVar15);
  if (uVar21 < uVar18) {
    __assert_fail("vc == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                  ,0xef1,"void mpz_xor(__mpz_struct *, const __mpz_struct *, const __mpz_struct *)")
    ;
  }
  if ((uint)uVar8 < (uint)uVar16) {
    do {
      uVar11 = pmVar1[uVar8] ^ uVar7;
      uVar14 = uVar11 + uVar10;
      uVar10 = (ulong)CARRY8(uVar11,uVar10);
      uVar14 = uVar14 ^ uVar7;
      mVar13 = uVar14 + uVar19;
      uVar19 = (ulong)CARRY8(uVar14,uVar19);
      pmVar6[uVar8] = mVar13;
      uVar8 = uVar8 + 1;
    } while (uVar8 < uVar16);
  }
  if (uVar19 == 0) {
    if (uVar16 != 0) {
      do {
        if (pmVar6[uVar16 - 1] != 0) goto LAB_00106da8;
        bVar3 = 1 < (long)uVar16;
        uVar16 = uVar16 - 1;
      } while (bVar3);
    }
    uVar16 = 0;
  }
  else {
    pmVar6[uVar16] = 1;
    uVar16 = uVar16 + 1;
  }
LAB_00106da8:
  iVar5 = -(int)uVar16;
  if (uVar9 == uVar22) {
    iVar5 = (int)uVar16;
  }
  r->_mp_size = iVar5;
  return;
}

Assistant:

void
mpz_xor (mpz_t r, const mpz_t u, const mpz_t v)
{
  mp_size_t un, vn, i;
  mp_ptr up, vp, rp;

  mp_limb_t ux, vx, rx;
  mp_limb_t uc, vc, rc;
  mp_limb_t ul, vl, rl;

  un = GMP_ABS (u->_mp_size);
  vn = GMP_ABS (v->_mp_size);
  if (un < vn)
    {
      MPZ_SRCPTR_SWAP (u, v);
      MP_SIZE_T_SWAP (un, vn);
    }
  if (vn == 0)
    {
      mpz_set (r, u);
      return;
    }

  uc = u->_mp_size < 0;
  vc = v->_mp_size < 0;
  rc = uc ^ vc;

  ux = -uc;
  vx = -vc;
  rx = -rc;

  rp = MPZ_REALLOC (r, un + (mp_size_t) rc);

  up = u->_mp_d;
  vp = v->_mp_d;

  i = 0;
  do
    {
      ul = (up[i] ^ ux) + uc;
      uc = ul < uc;

      vl = (vp[i] ^ vx) + vc;
      vc = vl < vc;

      rl = (ul ^ vl ^ rx) + rc;
      rc = rl < rc;
      rp[i] = rl;
    }
  while (++i < vn);
  assert (vc == 0);

  for (; i < un; i++)
    {
      ul = (up[i] ^ ux) + uc;
      uc = ul < uc;

      rl = (ul ^ ux) + rc;
      rc = rl < rc;
      rp[i] = rl;
    }
  if (rc)
    rp[un++] = rc;
  else
    un = mpn_normalized_size (rp, un);

  r->_mp_size = rx ? -un : un;
}